

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall
llvm::yaml::Node::Node
          (Node *this,uint Type,
          unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *D,
          StringRef A,StringRef T)

{
  Token *pTVar1;
  iterator Ptr;
  SMRange local_48;
  char *local_38;
  SMLoc Start;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *D_local;
  uint Type_local;
  Node *this_local;
  StringRef A_local;
  
  this->_vptr_Node = (_func_int **)&PTR_anchor_0044cde0;
  this->Doc = D;
  Start.Ptr = (char *)D;
  SMRange::SMRange(&this->SourceRange);
  this->TypeID = Type;
  (this->Anchor).Data = A.Data;
  (this->Anchor).Length = A.Length;
  (this->Tag).Data = T.Data;
  (this->Tag).Length = T.Length;
  pTVar1 = peekNext(this);
  Ptr = StringRef::begin(&pTVar1->Range);
  local_38 = (char *)SMLoc::getFromPointer(Ptr);
  SMRange::SMRange(&local_48,(SMLoc)local_38,(SMLoc)local_38);
  (this->SourceRange).Start.Ptr = local_48.Start.Ptr;
  (this->SourceRange).End.Ptr = local_48.End.Ptr;
  return;
}

Assistant:

Node::Node(unsigned int Type, std::unique_ptr<Document> &D, StringRef A,
           StringRef T)
    : Doc(D), TypeID(Type), Anchor(A), Tag(T) {
  SMLoc Start = SMLoc::getFromPointer(peekNext().Range.begin());
  SourceRange = SMRange(Start, Start);
}